

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

object __thiscall
pybind11::detail::accessor_policies::generic_item::get(generic_item *this,handle obj,handle key)

{
  long lVar1;
  error_already_set *this_00;
  
  lVar1 = PyObject_GetItem(obj.m_ptr,key.m_ptr);
  if (lVar1 != 0) {
    *(long *)this = lVar1;
    return (object)(handle)this;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

static object get(handle obj, handle key) {
        PyObject *result = PyObject_GetItem(obj.ptr(), key.ptr());
        if (!result) { throw error_already_set(); }
        return reinterpret_steal<object>(result);
    }